

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

Literal * __thiscall
wasm::extMul<4ul,unsigned_short,unsigned_int,(wasm::LaneOrder)0>
          (Literal *__return_storage_ptr__,wasm *this,Literal *a,Literal *b)

{
  Type *other;
  uint uVar1;
  uint uVar2;
  Literal *val;
  long lVar3;
  Literal *this_00;
  undefined1 local_228 [8];
  LaneArray<4UL_*_2> lhs;
  LaneArray<4UL_*_2> rhs;
  LaneArray<4UL> result;
  
  getLanes<unsigned_short,8>((LaneArray<8> *)local_228,this,a);
  getLanes<unsigned_short,8>((LaneArray<8> *)&lhs._M_elems[7].type,(wasm *)a,val);
  result._M_elems[3].field_0.i64 = 0;
  result._M_elems[3].field_0.func.super_IString.str._M_str = (char *)0x0;
  result._M_elems[2].field_0.func.super_IString.str._M_str = (char *)0x0;
  result._M_elems[2].type.id = 0;
  result._M_elems[1].type.id = 0;
  result._M_elems[2].field_0.i64 = 0;
  result._M_elems[1].field_0.i64 = 0;
  result._M_elems[1].field_0.func.super_IString.str._M_str = (char *)0x0;
  result._M_elems[0].field_0.func.super_IString.str._M_str = (char *)0x0;
  result._M_elems[0].type.id = 0;
  rhs._M_elems[7].type.id = 0;
  result._M_elems[0].field_0.i64 = 0;
  other = &result._M_elems[3].type;
  for (lVar3 = 0; lVar3 != 0x60; lVar3 = lVar3 + 0x18) {
    uVar1 = Literal::geti32((Literal *)(local_228 + lVar3));
    uVar2 = Literal::geti32((Literal *)((long)rhs._M_elems + lVar3 + -8));
    result._M_elems[3].type.id._0_4_ = (uVar2 & 0xffff) * (uVar1 & 0xffff);
    this_00 = (Literal *)((long)result._M_elems + lVar3 + -8);
    if (this_00 != (Literal *)other) {
      Literal::~Literal(this_00);
      Literal::Literal(this_00,(Literal *)other);
    }
    Literal::~Literal((Literal *)other);
  }
  Literal::Literal(__return_storage_ptr__,(LaneArray<4> *)&rhs._M_elems[7].type);
  std::array<wasm::Literal,_4UL>::~array((array<wasm::Literal,_4UL> *)&rhs._M_elems[7].type);
  std::array<wasm::Literal,_8UL>::~array((array<wasm::Literal,_8UL> *)&lhs._M_elems[7].type);
  std::array<wasm::Literal,_8UL>::~array((array<wasm::Literal,_8UL> *)local_228);
  return __return_storage_ptr__;
}

Assistant:

Literal extMul(const Literal& a, const Literal& b) {
  LaneArray<Lanes* 2> lhs = getLanes<LaneFrom, Lanes * 2>(a);
  LaneArray<Lanes* 2> rhs = getLanes<LaneFrom, Lanes * 2>(b);
  LaneArray<Lanes> result;
  for (size_t i = 0; i < Lanes; ++i) {
    size_t idx = (Side == LaneOrder::Low) ? i : i + Lanes;
    result[i] = Literal((LaneTo)(LaneFrom)lhs[idx].geti32() *
                        (LaneTo)(LaneFrom)rhs[idx].geti32());
  }
  return Literal(result);
}